

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

void png_ascii_from_fixed(png_const_structrp png_ptr,png_charp ascii,size_t size,png_fixed_point fp)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  char cStack_11;
  char digits [10];
  
  if (size < 0xd) {
    png_error(png_ptr,"ASCII conversion buffer too small");
  }
  if (fp < 0) {
    *ascii = '-';
    ascii = ascii + 1;
    fp = -fp;
  }
  digits[8] = '\0';
  digits[9] = '\0';
  digits[0] = '\0';
  digits[1] = '\0';
  digits[2] = '\0';
  digits[3] = '\0';
  digits[4] = '\0';
  digits[5] = '\0';
  digits[6] = '\0';
  digits[7] = '\0';
  uVar5 = 0;
  uVar4 = 0x10;
  while (uVar6 = (ulong)uVar5, fp != 0) {
    uVar1 = (uint)fp / 10;
    uVar5 = uVar5 + 1;
    digits[uVar6] = (char)((uint)fp % 10) + '0';
    uVar3 = uVar4;
    if ((uint)fp % 10 != 0) {
      uVar3 = uVar5;
    }
    fp = uVar1;
    if (uVar4 == 0x10) {
      uVar4 = uVar3;
    }
  }
  if (uVar5 == 0) {
    *ascii = '0';
    ascii = ascii + 1;
  }
  else {
    iVar2 = 0;
    for (; 5 < uVar6; uVar6 = uVar6 - 1) {
      *ascii = digits[uVar6 - 1];
      ascii = ascii + 1;
      iVar2 = iVar2 + 1;
    }
    if (uVar4 < 6) {
      *ascii = '.';
      for (uVar3 = 5; ascii = ascii + 1, uVar1 = uVar5 - iVar2, uVar5 - iVar2 < uVar3;
          uVar3 = uVar3 - 1) {
        *ascii = '0';
      }
      while( true ) {
        if (uVar1 < uVar4) break;
        *ascii = digits[uVar1 - 1];
        ascii = ascii + 1;
        uVar1 = uVar1 - 1;
      }
    }
  }
  *ascii = '\0';
  return;
}

Assistant:

void /* PRIVATE */
png_ascii_from_fixed(png_const_structrp png_ptr, png_charp ascii,
    size_t size, png_fixed_point fp)
{
   /* Require space for 10 decimal digits, a decimal point, a minus sign and a
    * trailing \0, 13 characters:
    */
   if (size > 12)
   {
      png_uint_32 num;

      /* Avoid overflow here on the minimum integer. */
      if (fp < 0)
      {
         *ascii++ = 45; num = (png_uint_32)(-fp);
      }
      else
         num = (png_uint_32)fp;

      if (num <= 0x80000000) /* else overflowed */
      {
         unsigned int ndigits = 0, first = 16 /* flag value */;
         char digits[10] = {0};

         while (num)
         {
            /* Split the low digit off num: */
            unsigned int tmp = num/10;
            num -= tmp*10;
            digits[ndigits++] = (char)(48 + num);
            /* Record the first non-zero digit, note that this is a number
             * starting at 1, it's not actually the array index.
             */
            if (first == 16 && num > 0)
               first = ndigits;
            num = tmp;
         }

         if (ndigits > 0)
         {
            while (ndigits > 5) *ascii++ = digits[--ndigits];
            /* The remaining digits are fractional digits, ndigits is '5' or
             * smaller at this point.  It is certainly not zero.  Check for a
             * non-zero fractional digit:
             */
            if (first <= 5)
            {
               unsigned int i;
               *ascii++ = 46; /* decimal point */
               /* ndigits may be <5 for small numbers, output leading zeros
                * then ndigits digits to first:
                */
               i = 5;
               while (ndigits < i)
               {
                  *ascii++ = 48; --i;
               }
               while (ndigits >= first) *ascii++ = digits[--ndigits];
               /* Don't output the trailing zeros! */
            }
         }
         else
            *ascii++ = 48;

         /* And null terminate the string: */
         *ascii = 0;
         return;
      }
   }

   /* Here on buffer too small. */
   png_error(png_ptr, "ASCII conversion buffer too small");
}